

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

string * __thiscall
cfd::core::Script::ToString_abi_cxx11_(string *__return_storage_ptr__,Script *this)

{
  pointer pSVar1;
  size_type sVar2;
  long lVar3;
  pointer this_00;
  pointer __value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  ostringstream os;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1b8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = (this->script_stack_).
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->script_stack_).
           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == pSVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      ScriptElement::ToString_abi_cxx11_(local_1a8,this_00);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                 local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pSVar1);
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_1b8._M_string = " ";
    lVar3 = (long)local_1d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_1b8._M_stream = (ostream_type *)local_1a8;
    if (0 < lVar3) {
      lVar3 = lVar3 + 1;
      __value = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
        ::operator=(&local_1b8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__value);
        __value = (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __value + 1);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    ::std::__cxx11::stringbuf::str();
    sVar2 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      ::std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    __return_storage_ptr__->_M_string_length = sVar2;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar2] = '\0';
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Script::ToString() const {
  if (script_stack_.empty()) {
    return "";
  }

  std::vector<std::string> str_list;
  for (const ScriptElement& element : script_stack_) {
    str_list.push_back(element.ToString());
  }

  const char* delimiter = " ";
  std::ostringstream os;
  std::copy(
      str_list.begin(), str_list.end(),
      std::ostream_iterator<std::string>(os, delimiter));
  std::string result = os.str();  // "a,b,c,"
  result.erase(result.size() - std::char_traits<char>::length(delimiter));
  return result;
}